

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strong_typedef.cpp
# Opt level: O0

void use_handle(handle h)

{
  int *piVar1;
  ostream *poVar2;
  int **ppiVar3;
  int *ptr;
  handle local_30;
  int local_24;
  int *piStack_20;
  int a;
  handle local_18;
  strong_typedef<handle,_int_*> local_10;
  handle h_local;
  
  local_10 = h.super_strong_typedef<handle,_int_*>.value_;
  piVar1 = type_safe::strong_typedef_op::dereference<handle,_int,_int_*,_const_int_*>::operator*
                     ((dereference<handle,_int,_int_*,_const_int_*> *)&local_10);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*piVar1);
  std::operator<<(poVar2,'\n');
  piStack_20 = (int *)0x0;
  handle::strong_typedef(&local_18,&stack0xffffffffffffffe0);
  type_safe::strong_typedef_op::operator==
            ((equality_comparison<handle> *)&local_10,(equality_comparison<handle> *)&local_18);
  ptr = &local_24;
  handle::strong_typedef(&local_30,&ptr);
  local_10 = local_30.super_strong_typedef<handle,_int_*>.value_;
  ppiVar3 = type_safe::strong_typedef::operator_cast_to_int__((strong_typedef *)&local_10);
  piVar1 = *ppiVar3;
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,&local_24);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,piVar1);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void use_handle(handle h)
{
    // we can dereference it
    std::cout << *h << '\n';

    // and compare it
    (void)(h == handle(nullptr));

    // and reassign
    int a;
    h = handle(&a);
    // or get back
    int* ptr = static_cast<int*>(h);
    std::cout << &a << ' ' << ptr << '\n';
}